

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O0

void __thiscall QDialogButtonBoxPrivate::layoutButtons(QDialogButtonBoxPrivate *this)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  long lVar7;
  QList<QAbstractButton_*> *this_00;
  QAbstractButton **ppQVar8;
  qsizetype qVar9;
  iterator o;
  QDialogButtonBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QPushButton *pushButton;
  QWidget *here;
  QWidgetList *__range2;
  QWidget *prev;
  QWidget *widget_1;
  int i_2;
  QList<QAbstractButton_*> *list;
  QAbstractButton *button;
  bool reverse;
  int role;
  QList<QAbstractButton_*> *acceptRoleList;
  int *currentLayout;
  int i_1;
  bool hasModalButton;
  int tmpPolicy;
  QWidget *widget;
  QLayoutItem *item;
  int i;
  int MacGap;
  QDialogButtonBox *q;
  iterator __end2;
  iterator __begin2;
  QWidgetList layoutWidgets;
  QScopedValueRollback<bool> blocker;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  QScopedValueRollback<bool> *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined1 value;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  undefined4 in_stack_fffffffffffffef0;
  QWidget *in_stack_ffffffffffffff08;
  QList<QAbstractButton_*> *in_stack_ffffffffffffff10;
  QList<QAbstractButton_*> *in_stack_ffffffffffffff18;
  QDialogButtonBoxPrivate *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff30;
  int iVar10;
  QWidget *in_stack_ffffffffffffff38;
  uint *local_a8;
  int local_9c;
  ButtonLayout local_94;
  int local_80;
  iterator local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 local_1c [4];
  undefined1 local_18 [16];
  long local_8;
  
  value = (undefined1)((ulong)in_stack_fffffffffffffee8 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QScopedValueRollback<bool>::QScopedValueRollback
            (in_stack_fffffffffffffee0,
             (bool *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),(bool)value);
  local_80 = (**(code **)(*(long *)&in_RDI->buttonLayout->super_QLayout + 200))();
  while (local_80 = local_80 + -1, -1 < local_80) {
    plVar6 = (long *)(**(code **)(*(long *)&in_RDI->buttonLayout->super_QLayout + 0xb0))
                               (in_RDI->buttonLayout,local_80);
    lVar7 = (**(code **)(*plVar6 + 0x68))();
    if (lVar7 != 0) {
      QWidget::hide((QWidget *)0x66bde4);
    }
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 8))();
    }
  }
  local_94 = in_RDI->layoutPolicy;
  if (local_94 == MacLayout) {
    bVar2 = false;
    for (local_9c = 0; local_9c < 5; local_9c = local_9c + 1) {
      bVar1 = QList<QAbstractButton_*>::isEmpty((QList<QAbstractButton_*> *)0x66be82);
      if (!bVar1) {
        bVar2 = true;
        break;
      }
    }
    if (!bVar2) {
      local_94 = AndroidLayout;
    }
  }
  local_a8 = (uint *)QPlatformDialogHelper::buttonLayout(in_RDI->orientation,local_94);
  if ((in_RDI->center & 1U) != 0) {
    QBoxLayout::addStretch((QBoxLayout *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  }
  this_00 = in_RDI->buttonLists;
  do {
    if (*local_a8 == 0xffffffff) {
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      QList<QWidget_*>::QList((QList<QWidget_*> *)0x66c1fb);
      iVar4 = 0;
      while (iVar10 = iVar4,
            iVar5 = (**(code **)(*(long *)&in_RDI->buttonLayout->super_QLayout + 200))(),
            iVar4 < iVar5) {
        plVar6 = (long *)(**(code **)(*(long *)&in_RDI->buttonLayout->super_QLayout + 0xa8))
                                   (in_RDI->buttonLayout,iVar10);
        lVar7 = (**(code **)(*plVar6 + 0x68))();
        if (lVar7 != 0) {
          QList<QWidget_*>::operator<<
                    ((QList<QWidget_*> *)in_stack_fffffffffffffee0,
                     (parameter_type)CONCAT44(iVar4,in_stack_fffffffffffffed8));
        }
        iVar4 = iVar10 + 1;
      }
      QWidget::setFocusProxy
                (in_stack_ffffffffffffff38,(QWidget *)CONCAT44(iVar10,in_stack_ffffffffffffff30));
      bVar2 = QList<QWidget_*>::isEmpty((QList<QWidget_*> *)0x66c298);
      if (!bVar2) {
        QList<QWidget_*>::constLast((QList<QWidget_*> *)CONCAT44(iVar4,in_stack_fffffffffffffed8));
        local_58.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
        local_58 = QList<QWidget_*>::begin((QList<QWidget_*> *)in_stack_fffffffffffffee0);
        o = QList<QWidget_*>::end((QList<QWidget_*> *)in_stack_fffffffffffffee0);
        while (bVar2 = QList<QWidget_*>::iterator::operator!=(&local_58,o), bVar2) {
          QList<QWidget_*>::iterator::operator*(&local_58);
          QWidget::setTabOrder(in_stack_ffffffffffffff08,(QWidget *)in_RDI);
          in_stack_ffffffffffffff08 = (QWidget *)qobject_cast<QPushButton*>((QObject *)0x66c376);
          if ((in_stack_ffffffffffffff08 != (QWidget *)0x0) &&
             (bVar2 = QPushButton::isDefault((QPushButton *)in_stack_fffffffffffffee0), bVar2)) {
            QWidget::setFocusProxy
                      (in_stack_ffffffffffffff38,
                       (QWidget *)CONCAT44(iVar10,in_stack_ffffffffffffff30));
          }
          QList<QWidget_*>::iterator::operator++(&local_58);
        }
      }
      if ((in_RDI->center & 1U) != 0) {
        QBoxLayout::addStretch((QBoxLayout *)in_stack_fffffffffffffee0,iVar4);
      }
      QList<QWidget_*>::~QList((QList<QWidget_*> *)0x66c3e9);
      QScopedValueRollback<bool>::~QScopedValueRollback((QScopedValueRollback<bool> *)local_18);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    uVar3 = *local_a8 & 0xbfffffff;
    if (uVar3 == 0) {
      bVar2 = QList<QAbstractButton_*>::isEmpty((QList<QAbstractButton_*> *)0x66bfe6);
      if (!bVar2) {
        ppQVar8 = QList<QAbstractButton_*>::first
                            ((QList<QAbstractButton_*> *)in_stack_fffffffffffffee0);
        alignment.i = (Int)((ulong)*ppQVar8 >> 0x20);
        in_stack_fffffffffffffee0 = (QScopedValueRollback<bool> *)in_RDI->buttonLayout;
        memset(local_1c,0,4);
        QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x66c042);
        QBoxLayout::addWidget
                  ((QBoxLayout *)in_stack_fffffffffffffee0,
                   (QWidget *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),0,
                   (Alignment)alignment.i);
        QWidget::show((QWidget *)CONCAT44(uVar3,in_stack_fffffffffffffef0));
      }
    }
    else if (uVar3 == 1) {
LAB_0066c17f:
      addButtonsToLayout(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                         SUB81((ulong)in_stack_ffffffffffffff10 >> 0x38,0));
    }
    else if (uVar3 == 2) {
      in_stack_ffffffffffffff38 = (QWidget *)(in_RDI->buttonLists + 2);
      if (((local_94 == MacLayout) &&
          (bVar2 = QList<QAbstractButton_*>::isEmpty((QList<QAbstractButton_*> *)0x66c103), !bVar2))
         && (iVar4 = (**(code **)(*(long *)&in_RDI->buttonLayout->super_QLayout + 200))(), 1 < iVar4
            )) {
        QBoxLayout::addSpacing((QBoxLayout *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      }
      addButtonsToLayout(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                         SUB81((ulong)in_stack_ffffffffffffff10 >> 0x38,0));
      if ((local_94 == MacLayout) &&
         (bVar2 = QList<QAbstractButton_*>::isEmpty((QList<QAbstractButton_*> *)0x66c163), !bVar2))
      {
        QBoxLayout::addSpacing((QBoxLayout *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      }
    }
    else {
      if (uVar3 - 3 < 6) goto LAB_0066c17f;
      if (uVar3 == 0x10000000) {
        qVar9 = QList<QAbstractButton_*>::size(this_00);
        if (1 < qVar9) {
          QList<QAbstractButton_*>::mid
                    (in_stack_ffffffffffffff10,(qsizetype)in_stack_ffffffffffffff08,
                     (qsizetype)in_RDI);
          addButtonsToLayout(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                             SUB81((ulong)in_stack_ffffffffffffff10 >> 0x38,0));
          QList<QAbstractButton_*>::~QList((QList<QAbstractButton_*> *)0x66c0bf);
        }
      }
      else if ((uVar3 == 0x20000000) && ((in_RDI->center & 1U) == 0)) {
        QBoxLayout::addStretch((QBoxLayout *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      }
    }
    local_a8 = local_a8 + 1;
  } while( true );
}

Assistant:

void QDialogButtonBoxPrivate::layoutButtons()
{
    Q_Q(QDialogButtonBox);
    const int MacGap = 36 - 8;    // 8 is the default gap between a widget and a spacer item

    QScopedValueRollback blocker(ignoreShowAndHide, true);
    for (int i = buttonLayout->count() - 1; i >= 0; --i) {
        QLayoutItem *item = buttonLayout->takeAt(i);
        if (QWidget *widget = item->widget())
            widget->hide();
        delete item;
    }

    int tmpPolicy = layoutPolicy;

    static const int M = 5;
    static const int ModalRoles[M] = { QPlatformDialogHelper::AcceptRole, QPlatformDialogHelper::RejectRole,
        QPlatformDialogHelper::DestructiveRole, QPlatformDialogHelper::YesRole, QPlatformDialogHelper::NoRole };
    if (tmpPolicy == QDialogButtonBox::MacLayout) {
        bool hasModalButton = false;
        for (int i = 0; i < M; ++i) {
            if (!buttonLists[ModalRoles[i]].isEmpty()) {
                hasModalButton = true;
                break;
            }
        }
        if (!hasModalButton)
            tmpPolicy = 4;  // Mac modeless
    }

    const int *currentLayout = QPlatformDialogHelper::buttonLayout(
        orientation, static_cast<QPlatformDialogHelper::ButtonLayout>(tmpPolicy));

    if (center)
        buttonLayout->addStretch();

    const QList<QAbstractButton *> &acceptRoleList = buttonLists[QPlatformDialogHelper::AcceptRole];

    while (*currentLayout != QPlatformDialogHelper::EOL) {
        int role = (*currentLayout & ~QPlatformDialogHelper::Reverse);
        bool reverse = (*currentLayout & QPlatformDialogHelper::Reverse);

        switch (role) {
        case QPlatformDialogHelper::Stretch:
            if (!center)
                buttonLayout->addStretch();
            break;
        case QPlatformDialogHelper::AcceptRole: {
            if (acceptRoleList.isEmpty())
                break;
            // Only the first one
            QAbstractButton *button = acceptRoleList.first();
            buttonLayout->addWidget(button);
            button->show();
        }
            break;
        case QPlatformDialogHelper::AlternateRole:
            if (acceptRoleList.size() > 1)
                addButtonsToLayout(acceptRoleList.mid(1), reverse);
            break;
        case QPlatformDialogHelper::DestructiveRole:
            {
                const QList<QAbstractButton *> &list = buttonLists[role];

                /*
                    Mac: Insert a gap on the left of the destructive
                    buttons to ensure that they don't get too close to
                    the help and action buttons (but only if there are
                    some buttons to the left of the destructive buttons
                    (and the stretch, whence buttonLayout->count() > 1
                    and not 0)).
                */
                if (tmpPolicy == QDialogButtonBox::MacLayout
                        && !list.isEmpty() && buttonLayout->count() > 1)
                    buttonLayout->addSpacing(MacGap);

                addButtonsToLayout(list, reverse);

                /*
                    Insert a gap between the destructive buttons and the
                    accept and reject buttons.
                */
                if (tmpPolicy == QDialogButtonBox::MacLayout && !list.isEmpty())
                    buttonLayout->addSpacing(MacGap);
            }
            break;
        case QPlatformDialogHelper::RejectRole:
        case QPlatformDialogHelper::ActionRole:
        case QPlatformDialogHelper::HelpRole:
        case QPlatformDialogHelper::YesRole:
        case QPlatformDialogHelper::NoRole:
        case QPlatformDialogHelper::ApplyRole:
        case QPlatformDialogHelper::ResetRole:
            addButtonsToLayout(buttonLists[role], reverse);
        }
        ++currentLayout;
    }

    QWidgetList layoutWidgets;
    for (int i = 0; i < buttonLayout->count(); ++i) {
        if (auto *widget = buttonLayout->itemAt(i)->widget())
            layoutWidgets << widget;
    }

    q->setFocusProxy(nullptr);
    if (!layoutWidgets.isEmpty()) {
        QWidget *prev = layoutWidgets.constLast();
        for (QWidget *here : layoutWidgets) {
            QWidget::setTabOrder(prev, here);
            prev = here;
            if (auto *pushButton = qobject_cast<QPushButton *>(prev); pushButton && pushButton->isDefault())
                q->setFocusProxy(pushButton);
        }
    }

    if (center)
        buttonLayout->addStretch();
}